

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImStrTrimBlanks(char *buf)

{
  char *__src;
  char *in_RDI;
  bool bVar1;
  char *p_start;
  char *p;
  char *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    __src = local_10;
    bVar1 = true;
    if (*local_10 != ' ') {
      bVar1 = *local_10 == '\t';
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  for (; *local_10 != '\0'; local_10 = local_10 + 1) {
  }
  while( true ) {
    bVar1 = false;
    if ((__src < local_10) && (bVar1 = true, local_10[-1] != ' ')) {
      bVar1 = local_10[-1] == '\t';
    }
    if (!bVar1) break;
    local_10 = local_10 + -1;
  }
  if (__src != in_RDI) {
    memmove(in_RDI,__src,(long)local_10 - (long)__src);
  }
  in_RDI[(long)local_10 - (long)__src] = '\0';
  return;
}

Assistant:

void ImStrTrimBlanks(char* buf)
{
    char* p = buf;
    while (p[0] == ' ' || p[0] == '\t')     // Leading blanks
        p++;
    char* p_start = p;
    while (*p != 0)                         // Find end of string
        p++;
    while (p > p_start && (p[-1] == ' ' || p[-1] == '\t'))  // Trailing blanks
        p--;
    if (p_start != buf)                     // Copy memory if we had leading blanks
        memmove(buf, p_start, p - p_start);
    buf[p - p_start] = 0;                   // Zero terminate
}